

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_datanode.c
# Opt level: O3

SUNErrCode SUNDataNode_GetNamedChild(SUNDataNode self,char *name,SUNDataNode *child_node)

{
  _func_SUNErrCode_SUNDataNode_char_ptr_SUNDataNode_ptr *UNRECOVERED_JUMPTABLE;
  SUNErrCode SVar1;
  
  UNRECOVERED_JUMPTABLE = self->ops->getnamedchild;
  if (UNRECOVERED_JUMPTABLE != (_func_SUNErrCode_SUNDataNode_char_ptr_SUNDataNode_ptr *)0x0) {
    SVar1 = (*UNRECOVERED_JUMPTABLE)(self,name,child_node);
    return SVar1;
  }
  return -0x2701;
}

Assistant:

SUNErrCode SUNDataNode_GetNamedChild(const SUNDataNode self, const char* name,
                                     SUNDataNode* child_node)
{
  SUNFunctionBegin(self->sunctx);

  SUNDIALS_MARK_FUNCTION_BEGIN(SUNCTX_->profiler);

  if (self->ops->getnamedchild)
  {
    SUNErrCode err = self->ops->getnamedchild(self, name, child_node);
    SUNDIALS_MARK_FUNCTION_END(SUNCTX_->profiler);
    return err;
  }

  SUNDIALS_MARK_FUNCTION_END(SUNCTX_->profiler);
  return SUN_ERR_NOT_IMPLEMENTED;
}